

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
::get_cbor_string(binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                  *this,string_t *result)

{
  size_t byte_;
  json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_00;
  anon_class_24_3_66f44b67 __gen;
  anon_class_24_3_66f44b67 __gen_00;
  anon_class_24_3_66f44b67 __gen_01;
  anon_class_24_3_66f44b67 __gen_02;
  undefined1 *puVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  string *psVar6;
  string_t chunk;
  bool success;
  string last_token;
  bool success_1;
  undefined1 local_d8 [8];
  size_type sStack_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  bVar2 = unexpect_eof(this,cbor,"string");
  if (!bVar2) {
    return false;
  }
  uVar5 = this->current;
  if (uVar5 - 0x60 < 0x18) {
    uVar5 = uVar5 & 0x1f;
    psVar6 = &local_b0;
    local_b0._M_dataplus._M_p._0_1_ = 1;
LAB_00118ffe:
    local_c8._M_allocated_capacity = (size_type)&local_90;
    local_90._M_dataplus._M_p._0_4_ = 1;
    __gen.success = (bool *)psVar6;
    __gen.this = this;
    __gen.format = (input_format_t *)&local_90;
    local_d8 = (undefined1  [8])this;
    sStack_d0 = (size_type)psVar6;
    std::
    generate_n<std::back_insert_iterator<std::__cxx11::string>,unsigned_int,nlohmann::detail::binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>::get_string<unsigned_int>(nlohmann::detail::input_format_t,unsigned_int,std::__cxx11::string&)::_lambda()_1_>
              ((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )result,uVar5,__gen);
  }
  else {
    switch(uVar5) {
    case 0x78:
      bVar2 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
              ::get_number<unsigned_char,false>
                        ((binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                          *)this,cbor,(uchar *)&local_70);
      if (!bVar2) {
        return false;
      }
      local_c8._M_allocated_capacity = (size_type)&local_90;
      local_90._M_dataplus._M_p._0_4_ = 1;
      psVar6 = &local_b0;
      local_b0._M_dataplus._M_p._0_1_ = 1;
      __gen_01.success = (bool *)psVar6;
      __gen_01.this = this;
      __gen_01.format = (input_format_t *)local_c8._M_allocated_capacity;
      local_d8 = (undefined1  [8])this;
      sStack_d0 = (size_type)psVar6;
      std::
      generate_n<std::back_insert_iterator<std::__cxx11::string>,unsigned_char,nlohmann::detail::binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>::get_string<unsigned_char>(nlohmann::detail::input_format_t,unsigned_char,std::__cxx11::string&)::_lambda()_1_>
                ((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )result,(uchar)local_70._M_dataplus._M_p,__gen_01);
      break;
    case 0x79:
      bVar2 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
              ::get_number<unsigned_short,false>
                        ((binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                          *)this,cbor,(unsigned_short *)&local_b0);
      if (!bVar2) {
        return false;
      }
      local_c8._M_allocated_capacity = (size_type)&local_90;
      local_90._M_dataplus._M_p._0_4_ = 1;
      psVar6 = &local_70;
      local_70._M_dataplus._M_p._0_1_ = 1;
      __gen_00.success = (bool *)psVar6;
      __gen_00.this = this;
      __gen_00.format = (input_format_t *)local_c8._M_allocated_capacity;
      local_d8 = (undefined1  [8])this;
      sStack_d0 = (size_type)psVar6;
      std::
      generate_n<std::back_insert_iterator<std::__cxx11::string>,unsigned_short,nlohmann::detail::binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>::get_string<unsigned_short>(nlohmann::detail::input_format_t,unsigned_short,std::__cxx11::string&)::_lambda()_1_>
                ((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )result,CONCAT11(local_b0._M_dataplus._M_p._1_1_,local_b0._M_dataplus._M_p._0_1_),
                 __gen_00);
      break;
    case 0x7a:
      bVar2 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
              ::get_number<unsigned_int,false>
                        ((binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                          *)this,cbor,(uint *)&local_b0);
      if (!bVar2) {
        return false;
      }
      uVar5 = CONCAT22(local_b0._M_dataplus._M_p._2_2_,
                       CONCAT11(local_b0._M_dataplus._M_p._1_1_,local_b0._M_dataplus._M_p._0_1_));
      psVar6 = &local_70;
      local_70._M_dataplus._M_p._0_1_ = '\x01';
      goto LAB_00118ffe;
    case 0x7b:
      bVar2 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
              ::get_number<unsigned_long,false>
                        ((binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                          *)this,cbor,(unsigned_long *)&local_90);
      if (!bVar2) {
        return false;
      }
      local_c8._M_allocated_capacity = (size_type)&local_b0;
      local_b0._M_dataplus._M_p._0_1_ = 1;
      local_b0._M_dataplus._M_p._1_1_ = 0;
      local_b0._M_dataplus._M_p._2_2_ = 0;
      psVar6 = &local_70;
      local_70._M_dataplus._M_p._0_1_ = 1;
      __gen_02.success = (bool *)psVar6;
      __gen_02.this = this;
      __gen_02.format = (input_format_t *)local_c8._M_allocated_capacity;
      local_d8 = (undefined1  [8])this;
      sStack_d0 = (size_type)psVar6;
      std::
      generate_n<std::back_insert_iterator<std::__cxx11::string>,unsigned_long,nlohmann::detail::binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>::get_string<unsigned_long>(nlohmann::detail::input_format_t,unsigned_long,std::__cxx11::string&)::_lambda()_1_>
                ((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )result,CONCAT44(local_90._M_dataplus._M_p._4_4_,local_90._M_dataplus._M_p._0_4_),
                 __gen_02);
      break;
    default:
      get_token_string(&local_90,this);
      byte_ = this->chars_read;
      this_00 = this->sax;
      std::operator+(&local_70,
                     "expected length specification (0x60-0x7B) or indefinite string type (0x7F); last byte: 0x"
                     ,&local_90);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"string","");
      exception_message(&local_b0,this,cbor,&local_70,&local_50);
      parse_error::create((parse_error *)local_d8,0x71,byte_,&local_b0);
      bVar2 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::parse_error(this_00,byte_,&local_90,(exception *)local_d8);
      local_d8 = (undefined1  [8])&PTR__exception_00131b78;
      std::runtime_error::~runtime_error((runtime_error *)local_c8._M_local_buf);
      std::exception::~exception((exception *)local_d8);
      puVar1 = (undefined1 *)
               CONCAT44(local_b0._M_dataplus._M_p._4_4_,
                        CONCAT22(local_b0._M_dataplus._M_p._2_2_,
                                 CONCAT11(local_b0._M_dataplus._M_p._1_1_,
                                          local_b0._M_dataplus._M_p._0_1_)));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar1 != &local_b0.field_2) {
        operator_delete(puVar1,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._M_dataplus._M_p._1_7_,(uchar)local_70._M_dataplus._M_p) !=
          &local_70.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_70._M_dataplus._M_p._1_7_,(uchar)local_70._M_dataplus._M_p),
                        local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_90._M_dataplus._M_p._4_4_,local_90._M_dataplus._M_p._0_4_) ==
          &local_90.field_2) {
        return bVar2;
      }
      operator_delete((undefined1 *)
                      CONCAT44(local_90._M_dataplus._M_p._4_4_,local_90._M_dataplus._M_p._0_4_),
                      local_90.field_2._M_allocated_capacity + 1);
      return bVar2;
    case 0x7f:
      do {
        this->chars_read = this->chars_read + 1;
        iVar4 = (**((this->ia).
                    super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_vptr_input_adapter_protocol)();
        this->current = iVar4;
        bVar2 = iVar4 == 0xff;
        if (bVar2) {
          return bVar2;
        }
        sStack_d0 = 0;
        local_c8._M_allocated_capacity = local_c8._M_allocated_capacity & 0xffffffffffffff00;
        local_d8 = (undefined1  [8])&local_c8;
        bVar3 = get_cbor_string(this,(string_t *)local_d8);
        if (bVar3) {
          std::__cxx11::string::_M_append((char *)result,(ulong)local_d8);
        }
        if (local_d8 != (undefined1  [8])&local_c8) {
          operator_delete((void *)local_d8,local_c8._M_allocated_capacity + 1);
        }
      } while (bVar3);
      return bVar2;
    }
  }
  return (bool)*(undefined1 *)&(psVar6->_M_dataplus)._M_p;
}

Assistant:

bool get_cbor_string(string_t& result)
    {
        if (JSON_HEDLEY_UNLIKELY(not unexpect_eof(input_format_t::cbor, "string")))
        {
            return false;
        }

        switch (current)
        {
            // UTF-8 string (0x00..0x17 bytes follow)
            case 0x60:
            case 0x61:
            case 0x62:
            case 0x63:
            case 0x64:
            case 0x65:
            case 0x66:
            case 0x67:
            case 0x68:
            case 0x69:
            case 0x6A:
            case 0x6B:
            case 0x6C:
            case 0x6D:
            case 0x6E:
            case 0x6F:
            case 0x70:
            case 0x71:
            case 0x72:
            case 0x73:
            case 0x74:
            case 0x75:
            case 0x76:
            case 0x77:
            {
                return get_string(input_format_t::cbor, static_cast<unsigned int>(current) & 0x1Fu, result);
            }

            case 0x78: // UTF-8 string (one-byte uint8_t for n follows)
            {
                std::uint8_t len;
                return get_number(input_format_t::cbor, len) and get_string(input_format_t::cbor, len, result);
            }

            case 0x79: // UTF-8 string (two-byte uint16_t for n follow)
            {
                std::uint16_t len;
                return get_number(input_format_t::cbor, len) and get_string(input_format_t::cbor, len, result);
            }

            case 0x7A: // UTF-8 string (four-byte uint32_t for n follow)
            {
                std::uint32_t len;
                return get_number(input_format_t::cbor, len) and get_string(input_format_t::cbor, len, result);
            }

            case 0x7B: // UTF-8 string (eight-byte uint64_t for n follow)
            {
                std::uint64_t len;
                return get_number(input_format_t::cbor, len) and get_string(input_format_t::cbor, len, result);
            }

            case 0x7F: // UTF-8 string (indefinite length)
            {
                while (get() != 0xFF)
                {
                    string_t chunk;
                    if (not get_cbor_string(chunk))
                    {
                        return false;
                    }
                    result.append(chunk);
                }
                return true;
            }

            default:
            {
                auto last_token = get_token_string();
                return sax->parse_error(chars_read, last_token, parse_error::create(113, chars_read, exception_message(input_format_t::cbor, "expected length specification (0x60-0x7B) or indefinite string type (0x7F); last byte: 0x" + last_token, "string")));
            }
        }
    }